

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree_test.c
# Opt level: O0

void test_speed(int nvalues)

{
  xrbt_iter_t pxVar1;
  xrbt_iter_t iter;
  uint local_30;
  int i;
  int count;
  int value;
  clock_t end;
  clock_t begin;
  xrbt_t *rb;
  int nvalues_local;
  
  rb._4_4_ = nvalues;
  begin = (clock_t)xrbt_new(4,on_cmp2,(xrbt_destroy_cb)0x0);
  srand(0x1e240);
  end = clock();
  iter._4_4_ = 0;
  do {
    if ((int)rb._4_4_ <= (int)iter._4_4_) {
LAB_00101709:
      _count = clock();
      printf("insert %d random integer done, values %u, time %lfs.\n",
             (double)(_count - end) / 1000000.0,(ulong)rb._4_4_,
             *(ulong *)(begin + 0x18) & 0xffffffff);
      tree_overview((xrbt_t *)begin);
      srand(0x1e240);
      end = clock();
      local_30 = 0;
      for (iter._4_4_ = 0; (int)iter._4_4_ < (int)rb._4_4_; iter._4_4_ = iter._4_4_ + 1) {
        i = rand_int();
        pxVar1 = xrbt_find((xrbt_t *)begin,&i);
        if (pxVar1 != (xrbt_iter_t)0x0) {
          local_30 = local_30 + 1;
        }
      }
      _count = clock();
      printf("search %d random integer done, time %lfs, %d found.\n",
             (double)(_count - end) / 1000000.0,(ulong)rb._4_4_,(ulong)local_30);
      srand(0x1e240);
      end = clock();
      local_30 = 0;
      for (iter._4_4_ = 0; (int)iter._4_4_ < (int)rb._4_4_; iter._4_4_ = iter._4_4_ + 1) {
        i = rand_int();
        pxVar1 = xrbt_find((xrbt_t *)begin,&i);
        if (pxVar1 == (xrbt_iter_t)0x0) {
          local_30 = local_30 + 1;
        }
        else {
          xrbt_erase((xrbt_t *)begin,pxVar1);
        }
      }
      _count = clock();
      printf("remove %d random integer done, time %lfs, %d not found.\n",
             (double)(_count - end) / 1000000.0,(ulong)rb._4_4_,(ulong)local_30);
      printf("press any key to continue...\n");
      getchar();
      xrbt_free((xrbt_t *)begin);
      return;
    }
    i = rand_int();
    pxVar1 = xrbt_insert_ex((xrbt_t *)begin,&i,*(size_t *)(begin + 0x10));
    if (pxVar1 == (xrbt_iter_t)0x0) {
      printf("out of memory when insert %d value.\n",(ulong)iter._4_4_);
      goto LAB_00101709;
    }
    iter._4_4_ = iter._4_4_ + 1;
  } while( true );
}

Assistant:

void test_speed(int nvalues)
{
    xrbt_t* rb = xrbt_new(sizeof(int), on_cmp2, NULL);
    clock_t begin, end;
    int value, count, i;

    srand(RAND_SEED);
    // generate 'nvalues' random integer and insert into 'rb'
    begin = clock();
    for (i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        if (!xrbt_insert(rb, &value))
        {
            printf("out of memory when insert %d value.\n", i);
            break;
        }
    }
    end = clock();
    printf("insert %d random integer done, values %u, time %lfs.\n",
            nvalues, (unsigned)xrbt_size(rb), (double)(end - begin) / CLOCKS_PER_SEC);

    tree_overview(rb);

    // reset the same seed to get the same series number
    srand(RAND_SEED);
    // search time test
    begin = clock();
    for (count = 0, i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        if (xrbt_find(rb, &value))
            ++count;
    }
    end = clock();
    printf("search %d random integer done, time %lfs, %d found.\n",
            nvalues, (double)(end - begin) / CLOCKS_PER_SEC, count);

    // reset the same seed to get the same series number
    srand(RAND_SEED);
    // remove time test
    begin = clock();
    for (count = 0, i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        xrbt_iter_t iter = xrbt_find(rb, &value);
        if (iter)
            xrbt_erase(rb, iter);
        else
            ++count;
    }
    end = clock();
    printf("remove %d random integer done, time %lfs, %d not found.\n",
            nvalues, (double)(end - begin) / CLOCKS_PER_SEC, count);

    printf("press any key to continue...\n");
    getchar();
    xrbt_free(rb);
}